

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

LY_ERR lyd_validate_choice_r
                 (lyd_node **first,lysc_node *sparent,lys_module *mod,lysc_ext_instance *ext,
                 uint32_t val_opts,uint32_t int_opts,ly_ht *getnext_ht,lyd_node **diff)

{
  lysc_node *plVar1;
  lysc_node *plVar2;
  lysc_node *plVar3;
  LY_ERR LVar4;
  lysc_node *plVar5;
  lyd_node *plVar6;
  lysc_node **pplVar7;
  lysc_node *parent;
  lyd_node *node;
  lyd_node *to_del;
  uint uVar8;
  lysc_node *parent_00;
  LY_ERR local_74;
  lysc_node *local_58;
  lysc_node *local_50;
  lysc_ext_instance *local_48;
  lysc_node **choices;
  lysc_node **snodes;
  
  local_48 = ext;
  local_74 = lyd_val_getnext_get(sparent,mod,ext,(byte)int_opts & 4,getnext_ht,&choices,&snodes);
  if (choices != (lysc_node **)0x0 && local_74 == LY_SUCCESS) {
    if (*first == (lyd_node *)0x0) {
      local_74 = LY_SUCCESS;
    }
    else {
      uVar8 = 0;
      local_74 = LY_SUCCESS;
      pplVar7 = choices;
      while( true ) {
        plVar5 = pplVar7[uVar8];
        if (plVar5 == (lysc_node *)0x0) break;
        ly_log_location(plVar5,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
        parent = *(lysc_node **)(plVar5 + 1);
        local_50 = plVar5;
        if (parent == (lysc_node *)0x0) {
          ly_log_location_revert(1,0,0,0);
        }
        else {
          plVar5 = (lysc_node *)0x0;
          parent_00 = (lysc_node *)0x0;
          do {
            local_58 = (lysc_node *)0x0;
            plVar6 = lys_getnext_data((lyd_node *)0x0,*first,&local_58,parent,(lysc_module *)0x0);
            if (plVar6 != (lyd_node *)0x0) {
              do {
                plVar1 = plVar5;
                plVar2 = parent;
                plVar3 = parent_00;
                if ((plVar6->flags & 4) != 0) break;
                plVar6 = lys_getnext_data(plVar6,*first,&local_58,parent,(lysc_module *)0x0);
                plVar1 = parent_00;
                plVar2 = plVar5;
                plVar3 = parent;
              } while (plVar6 != (lyd_node *)0x0);
              parent_00 = plVar3;
              plVar5 = plVar2;
              if (plVar1 != (lysc_node *)0x0) {
                ly_vlog(local_50->module->ctx,(char *)0x0,LYVE_DATA,
                        "Data for both cases \"%s\" and \"%s\" exist.",plVar1->name,parent->name);
                ly_log_location_revert(1,0,0,0);
                LVar4 = LY_EVALID;
                goto LAB_001b519f;
              }
            }
            parent = parent->next;
          } while (parent != (lysc_node *)0x0);
          ly_log_location_revert(1,0,0,0);
          if (parent_00 != (lysc_node *)0x0 && plVar5 != (lysc_node *)0x0) {
            local_58 = (lysc_node *)0x0;
            plVar6 = lys_getnext_data((lyd_node *)0x0,*first,&local_58,parent_00,(lysc_module *)0x0)
            ;
            node = (lyd_node *)0x0;
            if (plVar6 != (lyd_node *)0x0) {
              to_del = (lyd_node *)0x0;
LAB_001b50bd:
              node = plVar6;
              lyd_del_move_root(first,to_del,mod);
              lyd_free_tree(to_del);
              if ((diff == (lyd_node **)0x0) ||
                 (LVar4 = lyd_val_diff_add(node,LYD_DIFF_OP_DELETE,diff), LVar4 == LY_SUCCESS))
              goto LAB_001b50fd;
              if (LVar4 != LY_EVALID) {
                return LVar4;
              }
LAB_001b519f:
              local_74 = LY_EVALID;
              if ((val_opts & 4) == 0) {
                return LVar4;
              }
              goto LAB_001b51aa;
            }
LAB_001b5117:
            lyd_del_move_root(first,node,mod);
            lyd_free_tree(node);
          }
        }
LAB_001b51aa:
        pplVar7 = choices;
        LVar4 = lyd_validate_choice_r
                          (first,choices[uVar8],mod,local_48,val_opts,int_opts,getnext_ht,diff);
        if (LVar4 != LY_SUCCESS) {
          if (LVar4 != LY_EVALID) {
            return LVar4;
          }
          local_74 = LY_EVALID;
          if ((val_opts & 4) == 0) {
            return LY_EVALID;
          }
        }
        uVar8 = uVar8 + 1;
        if (*first == (lyd_node *)0x0) {
          return local_74;
        }
      }
    }
  }
  return local_74;
LAB_001b50fd:
  plVar6 = lys_getnext_data(node,*first,&local_58,parent_00,(lysc_module *)0x0);
  to_del = node;
  if (plVar6 == (lyd_node *)0x0) goto LAB_001b5117;
  goto LAB_001b50bd;
}

Assistant:

static LY_ERR
lyd_validate_choice_r(struct lyd_node **first, const struct lysc_node *sparent, const struct lys_module *mod,
        const struct lysc_ext_instance *ext, uint32_t val_opts, uint32_t int_opts, struct ly_ht *getnext_ht,
        struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    const struct lysc_node **choices, **snodes;
    uint32_t i;

    /* get cached getnext schema nodes */
    rc = lyd_val_getnext_get(sparent, mod, ext, int_opts & LYD_INTOPT_REPLY, getnext_ht, &choices, &snodes);
    LY_CHECK_GOTO(rc, cleanup);
    if (!choices) {
        goto cleanup;
    }

    for (i = 0; *first && choices[i]; ++i) {
        /* check case duplicites */
        r = lyd_validate_cases(first, mod, (struct lysc_node_choice *)choices[i], diff);
        LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

        /* check for nested choice */
        r = lyd_validate_choice_r(first, choices[i], mod, ext, val_opts, int_opts, getnext_ht, diff);
        LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);
    }

cleanup:
    return rc;
}